

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

CURLcode curl_mime_filename(curl_mimepart *part,char *filename)

{
  char *pcVar1;
  char *filename_local;
  curl_mimepart *part_local;
  
  if (part == (curl_mimepart *)0x0) {
    part_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    (*Curl_cfree)(part->filename);
    part->filename = (char *)0x0;
    if (filename != (char *)0x0) {
      pcVar1 = (*Curl_cstrdup)(filename);
      part->filename = pcVar1;
      if (part->filename == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    part_local._4_4_ = CURLE_OK;
  }
  return part_local._4_4_;
}

Assistant:

CURLcode curl_mime_filename(curl_mimepart *part, const char *filename)
{
  if(!part)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  Curl_safefree(part->filename);

  if(filename) {
    part->filename = strdup(filename);
    if(!part->filename)
      return CURLE_OUT_OF_MEMORY;
  }

  return CURLE_OK;
}